

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall
ON_Extrusion::Evaluate
          (ON_Extrusion *this,double u,double v,int num_der,int array_stride,double *der_array,
          int quadrant,int *hint)

{
  double dVar1;
  double dVar2;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector T_00;
  ON_3dVector T_01;
  bool bVar3;
  uint uVar4;
  double *pdVar5;
  ulong sz_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double *local_340;
  int local_334;
  ON_3dVector *local_328;
  ON_3dVector *local_320;
  uint local_314;
  void *tmp;
  size_t sz;
  double d;
  double *d0;
  double *d1;
  int j;
  int i;
  double xformD [3] [3];
  double xformP [3] [3];
  ON_3dPoint local_1f0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  ON_3dPoint local_1a8;
  undefined1 local_190 [8];
  ON_3dVector T;
  ON_Xform xform1;
  ON_Xform xform0;
  double t0;
  double t1;
  double dy;
  double dx;
  double y;
  double x;
  int *hint_local;
  int quadrant_local;
  double *der_array_local;
  int array_stride_local;
  int num_der_local;
  double v_local;
  double u_local;
  ON_Extrusion *this_local;
  
  if (this->m_profile == (ON_Curve *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    hint_local._4_4_ = quadrant;
    _array_stride_local = v;
    v_local = u;
    if ((this->m_bTransposed & 1U) != 0) {
      _array_stride_local = u;
      v_local = v;
      if (quadrant == 4) {
        hint_local._4_4_ = 2;
      }
      else if (quadrant == 2) {
        hint_local._4_4_ = 4;
      }
    }
    if ((hint_local._4_4_ == 1) || (hint_local._4_4_ == 4)) {
      local_314 = 1;
    }
    else {
      local_314 = 0;
      if (hint_local._4_4_ == 2 || hint_local._4_4_ == 3) {
        local_314 = 0xffffffff;
      }
    }
    uVar4 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                      (v_local,this->m_profile,(ulong)(uint)num_der,(ulong)(uint)array_stride,
                       der_array,(ulong)local_314,hint);
    if ((uVar4 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      dVar6 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,_array_stride_local);
      dVar7 = 1.0 - dVar6;
      ON_Xform::ON_Xform((ON_Xform *)(xform1.m_xform[3] + 3));
      ON_Xform::ON_Xform((ON_Xform *)&T.z);
      ON_Line::Tangent((ON_3dVector *)local_190,&this->m_path);
      if (((dVar7 != 0.0) || (NAN(dVar7))) || (0 < num_der)) {
        ON_Line::PointAt(&local_1a8,&this->m_path,(this->m_t).m_t[0]);
        local_1c0 = (double)local_190;
        local_1b8 = T.x;
        local_1b0 = T.y;
        local_1d8 = (this->m_up).x;
        local_1d0 = (this->m_up).y;
        local_1c8 = (this->m_up).z;
        if ((this->m_bHaveN[0] & 1U) == 0) {
          local_320 = (ON_3dVector *)0x0;
        }
        else {
          local_320 = this->m_N;
        }
        P.y = local_1a8.y;
        P.x = local_1a8.x;
        P.z = local_1a8.z;
        T_00.y = T.x;
        T_00.x = (double)local_190;
        T_00.z = T.y;
        bVar3 = ON_GetEndCapTransformation
                          (P,T_00,this->m_up,local_320,(ON_Xform *)(xform1.m_xform[3] + 3),
                           (ON_Xform *)0x0,(ON_Xform *)0x0);
        if (!bVar3) {
          return false;
        }
      }
      else {
        memcpy(xform1.m_xform[3] + 3,&ON_Xform::Zero4x4,0x80);
      }
      if (((dVar6 != 0.0) || (NAN(dVar6))) || (0 < num_der)) {
        ON_Line::PointAt(&local_1f0,&this->m_path,(this->m_t).m_t[1]);
        if ((this->m_bHaveN[1] & 1U) == 0) {
          local_328 = (ON_3dVector *)0x0;
        }
        else {
          local_328 = this->m_N + 1;
        }
        P_00.y = local_1f0.y;
        P_00.x = local_1f0.x;
        P_00.z = local_1f0.z;
        T_01.y = T.x;
        T_01.x = (double)local_190;
        T_01.z = T.y;
        bVar3 = ON_GetEndCapTransformation
                          (P_00,T_01,this->m_up,local_328,(ON_Xform *)&T.z,(ON_Xform *)0x0,
                           (ON_Xform *)0x0);
        if (!bVar3) {
          return false;
        }
      }
      else {
        memcpy(&T.z,&ON_Xform::Zero4x4,0x80);
      }
      dVar8 = dVar7 * xform1.m_xform[3][3] + dVar6 * T.z;
      dVar9 = dVar7 * xform0.m_xform[0][0] + dVar6 * xform1.m_xform[0][0];
      dVar10 = dVar7 * xform0.m_xform[0][3] + dVar6 * xform1.m_xform[0][3];
      dVar11 = dVar7 * xform0.m_xform[1][0] + dVar6 * xform1.m_xform[1][0];
      dVar12 = dVar7 * xform0.m_xform[1][3] + dVar6 * xform1.m_xform[1][3];
      dVar13 = dVar7 * xform0.m_xform[2][0] + dVar6 * xform1.m_xform[2][0];
      d0 = der_array + array_stride * (((num_der + 1) * (num_der + 2)) / 2 + -1);
      d = (double)(der_array + array_stride * num_der);
      y = *(double *)d;
      dx = *(double *)((long)d + 8);
      if (0 < num_der) {
        sz = (size_t)((this->m_path_domain).m_t[1] - (this->m_path_domain).m_t[0]);
        if (0.0 < (double)sz) {
          sz = (size_t)(1.0 / (double)sz);
        }
        dVar14 = (double)sz * (T.z - xform1.m_xform[3][3]);
        dVar15 = (double)sz * (xform1.m_xform[0][0] - xform0.m_xform[0][0]);
        dVar16 = (double)sz * (xform1.m_xform[0][3] - xform0.m_xform[0][3]);
        dVar17 = (double)sz * (xform1.m_xform[1][0] - xform0.m_xform[1][0]);
        dVar18 = (double)sz * (xform1.m_xform[1][3] - xform0.m_xform[1][3]);
        dVar19 = (double)sz * (xform1.m_xform[2][0] - xform0.m_xform[2][0]);
        for (d1._4_4_ = num_der; 0 < d1._4_4_; d1._4_4_ = d1._4_4_ + -1) {
          d = (double)((long)d + (long)array_stride * -8);
          dVar1 = *(double *)d;
          dVar2 = *(double *)((long)d + 8);
          d1._0_4_ = d1._4_4_;
          while (d1._0_4_ = (int)d1 + -1, (int)d1 != 0) {
            d0[2] = 0.0;
            d0[1] = 0.0;
            *d0 = 0.0;
            d0 = d0 + -(long)array_stride;
          }
          if (d1._4_4_ == 1) {
            *d0 = dVar14 * dVar1 + dVar15 * dVar2 +
                  (double)sz * (xform1.m_xform[0][2] - xform0.m_xform[0][2]);
            d0[1] = dVar16 * dVar1 + dVar17 * dVar2 +
                    (double)sz * (xform1.m_xform[1][2] - xform0.m_xform[1][2]);
            d0[2] = dVar18 * dVar1 + dVar19 * dVar2 +
                    (double)sz * (xform1.m_xform[2][2] - xform0.m_xform[2][2]);
          }
          else {
            *d0 = dVar14 * dVar1 + dVar15 * dVar2;
            d0[1] = dVar16 * dVar1 + dVar17 * dVar2;
            d0[2] = dVar18 * dVar1 + dVar19 * dVar2;
          }
          pdVar5 = d0 + -(long)array_stride;
          *pdVar5 = dVar8 * y + dVar9 * dx;
          pdVar5[1] = dVar10 * y + dVar11 * dx;
          pdVar5[2] = dVar12 * y + dVar13 * dx;
          d0 = pdVar5 + -(long)array_stride;
          dx = dVar2;
          y = dVar1;
        }
      }
      *d0 = dVar8 * y + dVar9 * dx + dVar7 * xform0.m_xform[0][2] + dVar6 * xform1.m_xform[0][2];
      d0[1] = dVar10 * y + dVar11 * dx + dVar7 * xform0.m_xform[1][2] + dVar6 * xform1.m_xform[1][2]
      ;
      d0[2] = dVar12 * y + dVar13 * dx + dVar7 * xform0.m_xform[2][2] + dVar6 * xform1.m_xform[2][2]
      ;
      if (((this->m_bTransposed & 1U) != 0) && (0 < num_der)) {
        local_334 = array_stride;
        if (2 < array_stride) {
          local_334 = 3;
        }
        sz_00 = (long)local_334 << 3;
        if (sz_00 < 0x81) {
          local_340 = xform1.m_xform[3] + 3;
        }
        else {
          local_340 = (double *)onmalloc(sz_00);
        }
        for (d1._4_4_ = 1; d1._4_4_ <= num_der; d1._4_4_ = d1._4_4_ + 1) {
          d = (double)(der_array + (array_stride * d1._4_4_ * (d1._4_4_ + 1)) / 2);
          d0 = (double *)((long)d + (long)(array_stride * d1._4_4_) * 8);
          for (; (ulong)d < d0; d = (double)((long)d + (long)array_stride * 8)) {
            memcpy(local_340,(void *)d,sz_00);
            memcpy((void *)d,d0,sz_00);
            memcpy(d0,local_340,sz_00);
            d0 = d0 + -(long)array_stride;
          }
        }
        if (local_340 != xform1.m_xform[3] + 3) {
          onfree(local_340);
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Extrusion::Evaluate( // returns false if unable to evaluate
       double u, double v,   // evaluation parameters
       int num_der,          // number of derivatives (>=0)
       int array_stride,     // array stride (>=Dimension())
       double* der_array,    // array of length stride*(ndir+1)*(ndir+2)/2
       int quadrant ,     // optional - determines which quadrant to evaluate from
                             //         0 = default
                             //         1 from NE quadrant
                             //         2 from NW quadrant
                             //         3 from SW quadrant
                             //         4 from SE quadrant
       int* hint          // optional - evaluation hint (int[2]) used to speed
                             //            repeated evaluations
       ) const 
{
  if ( !m_profile )
    return false;

  double x,y,dx,dy;
  //int side = 0;
  if ( m_bTransposed ) 
  {
    x = u; u = v; v = x;
    if ( 4 == quadrant )
      quadrant = 2;
    else if ( 2 == quadrant )
      quadrant = 4;
  }

  if ( !m_profile->Evaluate( u, num_der, array_stride, der_array,
                             (1==quadrant||4==quadrant)?1:((2==quadrant||3==quadrant)?-1:0),
                               hint) 
     )
  {
    return false;
  }

  // TODO: After testing, add special case that avoids
  //       two calls to GetProfileTransformation() when 
  //       mitering is trivial.
  const double t1 = m_path_domain.NormalizedParameterAt(v);
  const double t0 = 1.0-t1;
  ON_Xform xform0, xform1;
  const ON_3dVector T = m_path.Tangent();

  if ( 0.0 != t0 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[0]),T,m_up,m_bHaveN[0]?&m_N[0]:0,xform0,0,0) )
      return false;
  }
  else
  {
    xform0 = ON_Xform::Zero4x4;
  }

  if ( 0.0 != t1 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[1]),T,m_up,m_bHaveN[1]?&m_N[1]:0,xform1,0,0) )
      return false;
  }
  else
  {
    xform1 = ON_Xform::Zero4x4;
  }

  double xformP[3][3], xformD[3][3];
  xformP[0][0] = t0*xform0.m_xform[0][0] + t1*xform1.m_xform[0][0];
  xformP[0][1] = t0*xform0.m_xform[0][1] + t1*xform1.m_xform[0][1];
  xformP[0][2] = t0*xform0.m_xform[0][3] + t1*xform1.m_xform[0][3];
  xformP[1][0] = t0*xform0.m_xform[1][0] + t1*xform1.m_xform[1][0];
  xformP[1][1] = t0*xform0.m_xform[1][1] + t1*xform1.m_xform[1][1];
  xformP[1][2] = t0*xform0.m_xform[1][3] + t1*xform1.m_xform[1][3];
  xformP[2][0] = t0*xform0.m_xform[2][0] + t1*xform1.m_xform[2][0];
  xformP[2][1] = t0*xform0.m_xform[2][1] + t1*xform1.m_xform[2][1];
  xformP[2][2] = t0*xform0.m_xform[2][3] + t1*xform1.m_xform[2][3];

  int i,j;
  i = num_der+1;
  double* d1 = der_array + array_stride*(i*(i+1)/2 - 1);
  double* d0 = der_array + array_stride*(i - 1);
  x = d0[0];
  y = d0[1];
  if ( num_der > 0 )
  {
    double d = m_path_domain.m_t[1] - m_path_domain.m_t[0];
    if ( d > 0.0 )
      d = 1.0/d;
    xformD[0][0] = d*(xform1.m_xform[0][0] - xform0.m_xform[0][0]);
    xformD[0][1] = d*(xform1.m_xform[0][1] - xform0.m_xform[0][1]);
    xformD[0][2] = d*(xform1.m_xform[0][3] - xform0.m_xform[0][3]);
    xformD[1][0] = d*(xform1.m_xform[1][0] - xform0.m_xform[1][0]);
    xformD[1][1] = d*(xform1.m_xform[1][1] - xform0.m_xform[1][1]);
    xformD[1][2] = d*(xform1.m_xform[1][3] - xform0.m_xform[1][3]);
    xformD[2][0] = d*(xform1.m_xform[2][0] - xform0.m_xform[2][0]);
    xformD[2][1] = d*(xform1.m_xform[2][1] - xform0.m_xform[2][1]);
    xformD[2][2] = d*(xform1.m_xform[2][3] - xform0.m_xform[2][3]);

    for ( i = num_der; i > 0; i-- )
    {
      dx = x;
      dy = y;
      d0 -= array_stride;
      x = d0[0];
      y = d0[1];

      // all partials involving two or more derivatives with
      // respect to "v" are zero.
      j = i;
      while ( --j )
      {
        d1[0] = d1[1] = d1[2] = 0.0;
        d1 -= array_stride;
      }    

      // The partial involving a single derivative with respect to "v"
      if ( 1 == i )
      {
        // xformD transform is applied to curve location ((x,y) = point)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y + xformD[0][2];
        d1[1] = xformD[1][0]*x + xformD[1][1]*y + xformD[1][2];
        d1[2] = xformD[2][0]*x + xformD[2][1]*y + xformD[2][2];
      }
      else
      {
        // xformD transform is applied to a curve derivative ((x,y) = vector)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y;
        d1[1] = xformD[1][0]*x + xformD[1][1]*y;
        d1[2] = xformD[2][0]*x + xformD[2][1]*y;
      }
      d1 -= array_stride;

      // The partial involving a all derivatives with respect to "u"
      // xformP transformation is applied to a curve derivative ((x,y) = vector)
      d1[0] = xformP[0][0]*dx + xformP[0][1]*dy;
      d1[1] = xformP[1][0]*dx + xformP[1][1]*dy;
      d1[2] = xformP[2][0]*dx + xformP[2][1]*dy;
      d1 -= array_stride;
    }
  }
  // xformP transformation is applied curve location ((x,y) = point)
  d1[0] = xformP[0][0]*x + xformP[0][1]*y + xformP[0][2];
  d1[1] = xformP[1][0]*x + xformP[1][1]*y + xformP[1][2];
  d1[2] = xformP[2][0]*x + xformP[2][1]*y + xformP[2][2];

  if ( m_bTransposed && num_der > 0)
  {
    // reverse order of derivatives
    const size_t sz = ((3 <= array_stride)?3:array_stride)*sizeof(double);
    void* tmp = ( sz <= sizeof(xform0) )
              ? ((void*)&xform0.m_xform[0][0])
              : onmalloc(sz);
    for ( i = 1; i <= num_der; i++ )
    {
      d0 = der_array + array_stride*(i*(i+1))/2;
      d1 = d0 + array_stride*i;
      while ( d0 < d1)
      {
        memcpy(tmp,d0,sz);
        memcpy(d0,d1,sz);
        memcpy(d1,tmp,sz);
        d0 += array_stride;
        d1 -= array_stride;
      }
    }
    if ( tmp != ((void*)&xform0.m_xform[0][0]) )
      onfree(tmp);
  }

  return true;
}